

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# price_update_decoder_test.cpp
# Opt level: O1

void __thiscall
bidfx_public_api::price::pixie::PriceUpdateDecoderTest_test_decode_long_field_Test::
PriceUpdateDecoderTest_test_decode_long_field_Test
          (PriceUpdateDecoderTest_test_decode_long_field_Test *this)

{
  testing::Test::Test((Test *)this);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029e1d0;
  bidfx_public_api::tools::ByteBuffer::ByteBuffer
            (&(this->super_PriceUpdateDecoderTest).buffer,0x2000);
  (this->super_PriceUpdateDecoderTest).super_Test._vptr_Test =
       (_func_int **)&PTR__PriceUpdateDecoderTest_0029df68;
  return;
}

Assistant:

TEST_F(PriceUpdateDecoderTest, test_decode_long_field)
{
    int64_t value = 483948038L;
    buffer.WriteLong(value);
    FieldDef field_def = FieldDef(1, FieldTypeEnum::LONG, "field");
    PriceField field = PriceUpdateDecoder::DecodeField(buffer, field_def);
    EXPECT_EQ(PriceField::LONG, field.GetType());
    EXPECT_EQ(value, field.GetLong());
}